

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void INT_REVunstall_stone(CMConnection conn,EVstone stone_id)

{
  int iVar1;
  CMFormat p_Var2;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int unaff_retaddr;
  EVunstall_stone_request request;
  CMFormat f;
  int cond;
  CMFormat in_stack_ffffffffffffffd8;
  CMConnection in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  undefined4 uVar4;
  
  memset(&stack0xffffffffffffffe0,0,8);
  iVar1 = INT_CMCondition_get((CManager)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffe8);
  p_Var2 = INT_CMlookup_format((CManager)*in_RDI,EVunstall_stone_req_formats);
  iVar3 = iVar1;
  uVar4 = in_ESI;
  if (p_Var2 == (CMFormat)0x0) {
    p_Var2 = INT_CMregister_format((CManager)0x0,(FMStructDescList)CONCAT44(in_ESI,iVar1));
  }
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(uVar4,iVar3),(int)((ulong)p_Var2 >> 0x20),
             (void *)CONCAT44(in_ESI,iVar1));
  INT_CMwrite((CMConnection)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffd8,(void *)0x156bc7);
  INT_CMCondition_wait((CManager)request,unaff_retaddr);
  return;
}

Assistant:

extern void
INT_REVunstall_stone(CMConnection conn, EVstone stone_id)
{
    int cond;
    CMFormat f;
    EVunstall_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVunstall_stone_req_formats);
    request.stone_id = stone_id;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVunstall_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}